

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcCom.c
# Opt level: O3

int Abc_CommandBlast(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Wlc_Ntk_t *p;
  int iVar1;
  uint uVar2;
  Gia_Man_t *p_00;
  Gia_Man_t *pGVar3;
  FILE *__stream;
  Vec_Ptr_t *pVVar4;
  int iVar5;
  char *pcVar6;
  int iVar7;
  char *pcVar8;
  ulong uVar9;
  int CountM;
  int CountA;
  uint local_100;
  uint local_fc;
  uint local_f8;
  uint local_f4;
  uint local_f0;
  uint local_ec;
  uint local_e8;
  uint local_e4;
  uint local_e0;
  uint local_dc;
  uint local_d8;
  uint local_d4;
  Wlc_BstPar_t local_d0;
  uint local_88;
  uint local_84;
  uint local_80;
  uint local_7c;
  uint local_78;
  uint local_74;
  uint local_70;
  uint local_6c;
  uint local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  ulong local_50;
  uint local_48;
  uint local_44;
  Abc_Frame_t *local_40;
  Wlc_Ntk_t *local_38;
  
  local_38 = (Wlc_Ntk_t *)pAbc->pAbcWlc;
  local_d0.vBoxIds = (Vec_Int_t *)0x0;
  local_d0.fCreateWordMiter = 0;
  local_d0.fDecMuxes = 0;
  local_d0.fSaveFfNames = 0;
  local_d0.fVerbose = 0;
  local_d0.fNonRest = 0;
  local_d0.fCla = 0;
  local_d0.fNoCleanup = 0;
  local_d0.fCreateMiter = 0;
  local_d0.iOutput = -1;
  local_d0.nOutputRange = 2;
  local_d0.nAdderLimit = 0;
  local_d0.nMultLimit = 0;
  local_d0.fGiaSimple = 0;
  local_d0.fAddOutputs = 0;
  local_50 = 0;
  local_d0.fMulti = 0;
  local_d0.fBooth = 0;
  local_40 = pAbc;
  Extra_UtilGetoptReset();
  local_100 = local_d0.fVerbose;
  local_fc = local_d0.fSaveFfNames;
  local_f8 = local_d0.fCreateWordMiter;
  local_f4 = local_d0.fCla;
  local_f0 = local_d0.fBooth;
  local_ec = local_d0.fMulti;
  local_e8 = local_d0.fAddOutputs;
  local_e4 = local_d0.fGiaSimple;
  local_e0 = local_d0.nAdderLimit;
  uVar9 = (ulong)local_d0._8_8_ >> 0x20;
  local_dc = 0xffffffff;
  local_54 = 2;
  local_58 = 0;
  local_74 = 0;
  local_70 = 0;
  local_d8 = 0;
  local_6c = 0;
  local_68 = 0;
  local_64 = 0;
  local_60 = 0;
  local_5c = 0;
  local_7c = 0;
  local_78 = 0;
  local_d4 = 0;
  local_88 = 0;
  local_80 = 0;
  local_84 = 0;
LAB_003598dc:
  do {
    iVar7 = (int)uVar9;
    iVar1 = Extra_UtilGetopt(argc,argv,"ORAMcombqadestnizvh");
    p = local_38;
    iVar5 = globalUtilOptind;
    if (iVar1 < 0x4f) {
      if (iVar1 == 0x41) {
        if (argc <= globalUtilOptind) {
          pcVar6 = "Command line switch \"-A\" should be followed by an integer.\n";
LAB_00359d64:
          local_d0.nMultLimit = iVar7;
          local_d0.nAdderLimit = local_e0;
          local_d0.fVerbose = local_100;
          local_d0.fSaveFfNames = local_fc;
          local_d0.fCreateWordMiter = local_f8;
          local_d0.fCla = local_f4;
          local_d0.fBooth = local_f0;
          local_d0.fMulti = local_ec;
          local_d0.fAddOutputs = local_e8;
          local_d0.fGiaSimple = local_e4;
          Abc_Print(-1,pcVar6);
          goto LAB_00359d70;
        }
        uVar2 = atoi(argv[globalUtilOptind]);
        local_e0 = uVar2;
        local_58 = uVar2;
      }
      else {
        if (iVar1 != 0x4d) {
          if (iVar1 == -1) {
            local_d0.fVerbose = local_100;
            local_d0.fSaveFfNames = local_fc;
            local_d0.fBooth = local_f0;
            local_d0.fMulti = local_ec;
            local_d0.fAddOutputs = local_e8;
            local_d0.fGiaSimple = local_e4;
            local_d0.nMultLimit = iVar7;
            local_d0.nAdderLimit = local_e0;
            local_d0.fCreateMiter = local_d4;
            local_d0.fDecMuxes = local_78;
            local_d0.fCreateWordMiter = local_f8;
            local_d0.fCla = local_f4;
            local_d0.fNonRest = local_7c;
            if (local_38 == (Wlc_Ntk_t *)0x0) {
              pcVar6 = "Abc_CommandBlast(): There is no current design.\n";
            }
            else if (local_38->fAsyncRst == 0) {
              if (local_80 != 0) {
                Wlc_NtkPrintInputInfo(local_38);
              }
              if (local_d8 == 0) {
                uVar9 = (ulong)local_dc;
                if (local_58 != 0 || (int)local_50 != 0) {
                  local_d0.vBoxIds =
                       Wlc_NtkCollectAddMult(p,&local_d0,(int *)&local_44,(int *)&local_48);
                  if (local_d0.vBoxIds == (Vec_Int_t *)0x0) {
                    Abc_Print(1,
                              "Warning:  There is no adders and multipliers that will not be blasted.\n"
                             );
                  }
                  else {
                    Abc_Print(1,"Warning:  %d adders and %d multipliers will not be blasted.\n",
                              (ulong)local_44,(ulong)local_48);
                  }
                  uVar9 = local_d0._0_8_ & 0xffffffff;
                }
              }
              else {
                local_d0.vBoxIds = Wlc_NtkCollectMultipliers(p);
                if (local_d0.vBoxIds == (Vec_Int_t *)0x0) {
                  Abc_Print(1,"Warning:  There is no multipliers in the design.\n");
                }
                uVar9 = (ulong)local_dc;
              }
              if (-1 < (int)uVar9) {
                iVar5 = local_d0.nOutputRange + (int)uVar9;
                if ((p->vPos).nSize < iVar5) {
                  Abc_Print(1,"Abc_CommandBlast(): The output range [%d:%d] is incorrect.\n",uVar9,
                            (ulong)(iVar5 - 1));
                  return 0;
                }
              }
              p_00 = Wlc_NtkBitBlast(p,&local_d0);
              Vec_IntFreeP(&local_d0.vBoxIds);
              if (p_00 != (Gia_Man_t *)0x0) {
                if (local_84 != 0) {
                  pGVar3 = Gia_ManTransformMiter(p_00);
                  Gia_ManStop(p_00);
                  Abc_Print(1,
                            "Bit-blasting created a traditional multi-output miter by XORing POs pair-wise.\n"
                           );
                  p_00 = pGVar3;
                  if (local_88 != 0) {
                    __stream = fopen("pio_name_map.txt","wb");
                    pVVar4 = pGVar3->vNamesIn;
                    if ((pVVar4 != (Vec_Ptr_t *)0x0) && (0 < pVVar4->nSize)) {
                      uVar9 = 0;
                      do {
                        fprintf(__stream,"i%d %s\n",uVar9 & 0xffffffff,pVVar4->pArray[uVar9]);
                        uVar9 = uVar9 + 1;
                        pVVar4 = pGVar3->vNamesIn;
                      } while ((long)uVar9 < (long)pVVar4->nSize);
                    }
                    pVVar4 = pGVar3->vNamesOut;
                    if ((pVVar4 != (Vec_Ptr_t *)0x0) && (0 < pVVar4->nSize)) {
                      uVar9 = 0;
                      do {
                        fprintf(__stream,"o%d %s\n",uVar9 & 0xffffffff,pVVar4->pArray[uVar9]);
                        uVar9 = uVar9 + 1;
                        pVVar4 = pGVar3->vNamesOut;
                      } while ((long)uVar9 < (long)pVVar4->nSize);
                    }
                    fclose(__stream);
                    Abc_Print(1,
                              "Finished dumping file \"pio_name_map.txt\" containing PI/PO name mapping.\n"
                             );
                  }
                }
                Abc_FrameUpdateGia(local_40,p_00);
                return 0;
              }
              pcVar6 = "Abc_CommandBlast(): Bit-blasting has failed.\n";
            }
            else {
              pcVar6 = "Abc_CommandBlast(): Trying to bit-blast network with asynchronous reset.\n";
            }
            Abc_Print(1,pcVar6);
            return 0;
          }
          goto switchD_00359902_caseD_66;
        }
        if (argc <= globalUtilOptind) {
          pcVar6 = "Command line switch \"-M\" should be followed by an integer.\n";
          goto LAB_00359d64;
        }
        uVar2 = atoi(argv[globalUtilOptind]);
        uVar9 = (ulong)uVar2;
        local_50 = uVar9;
      }
    }
    else {
      switch(iVar1) {
      case 0x61:
        local_f4 = local_68 ^ 1;
        local_68 = local_f4;
        goto LAB_003598dc;
      case 0x62:
        local_f0 = local_6c ^ 1;
        local_6c = local_f0;
        goto LAB_003598dc;
      case 99:
        local_e4 = local_74 ^ 1;
        local_74 = local_e4;
        goto LAB_003598dc;
      case 100:
        local_d4 = local_d4 ^ 1;
        goto LAB_003598dc;
      case 0x65:
        local_f8 = local_64 ^ 1;
        local_64 = local_f8;
        goto LAB_003598dc;
      case 0x66:
      case 0x67:
      case 0x68:
      case 0x6a:
      case 0x6b:
      case 0x6c:
      case 0x70:
      case 0x72:
      case 0x75:
      case 0x77:
      case 0x78:
      case 0x79:
        goto switchD_00359902_caseD_66;
      case 0x69:
        local_80 = local_80 ^ 1;
        goto LAB_003598dc;
      case 0x6d:
        local_ec = local_d8 ^ 1;
        local_d8 = local_ec;
        goto LAB_003598dc;
      case 0x6e:
        local_88 = local_88 ^ 1;
        goto LAB_003598dc;
      case 0x6f:
        local_e8 = local_70 ^ 1;
        local_70 = local_e8;
        goto LAB_003598dc;
      case 0x71:
        local_7c = local_7c ^ 1;
        goto LAB_003598dc;
      case 0x73:
        local_78 = local_78 ^ 1;
        goto LAB_003598dc;
      case 0x74:
        local_d4 = local_d4 ^ 1;
        local_84 = local_84 ^ 1;
        goto LAB_003598dc;
      case 0x76:
        local_100 = local_5c ^ 1;
        local_5c = local_100;
        goto LAB_003598dc;
      case 0x7a:
        local_fc = local_60 ^ 1;
        local_60 = local_fc;
        goto LAB_003598dc;
      default:
        if (iVar1 == 0x52) {
          if (argc <= globalUtilOptind) {
            pcVar6 = "Command line switch \"-R\" should be followed by an integer.\n";
            goto LAB_00359d64;
          }
          uVar2 = atoi(argv[globalUtilOptind]);
          local_d0.nOutputRange = uVar2;
          local_54 = uVar2;
        }
        else {
          if (iVar1 != 0x4f) goto switchD_00359902_caseD_66;
          if (argc <= globalUtilOptind) {
            pcVar6 = "Command line switch \"-O\" should be followed by an integer.\n";
            goto LAB_00359d64;
          }
          uVar2 = atoi(argv[globalUtilOptind]);
          local_d0.iOutput = uVar2;
          local_dc = uVar2;
        }
      }
    }
    globalUtilOptind = iVar5 + 1;
    iVar7 = (int)uVar9;
    if ((int)uVar2 < 0) {
switchD_00359902_caseD_66:
      local_d0.fVerbose = local_100;
      local_d0.fSaveFfNames = local_fc;
      local_d0.fCreateWordMiter = local_f8;
      local_d0.fCla = local_f4;
      local_d0.fBooth = local_f0;
      local_d0.fMulti = local_ec;
      local_d0.fAddOutputs = local_e8;
      local_d0.fGiaSimple = local_e4;
      local_d0.nMultLimit = iVar7;
      local_d0.nAdderLimit = local_e0;
LAB_00359d70:
      Abc_Print(-2,"usage: %%blast [-ORAM num] [-combqadestnizvh]\n");
      Abc_Print(-2,"\t         performs bit-blasting of the word-level design\n");
      Abc_Print(-2,
                "\t-O num : zero-based index of the first word-level PO to bit-blast [default = %d]\n"
                ,(ulong)local_dc);
      Abc_Print(-2,"\t-R num : the total number of word-level POs to bit-blast [default = %d]\n",
                (ulong)local_54);
      Abc_Print(-2,"\t-A num : blast adders smaller than this (0 = unused) [default = %d]\n",
                (ulong)local_58);
      Abc_Print(-2,"\t-M num : blast multipliers smaller than this (0 = unused) [default = %d]\n",
                local_50);
      pcVar8 = "yes";
      pcVar6 = "yes";
      if (local_74 == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,
                "\t-c     : toggle using AIG w/o const propagation and strashing [default = %s]\n",
                pcVar6);
      pcVar6 = "yes";
      if (local_70 == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,
                "\t-o     : toggle using additional POs on the word-level boundaries [default = %s]\n"
                ,pcVar6);
      pcVar6 = "yes";
      if (local_d8 == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,
                "\t-m     : toggle creating boxes for all multipliers in the design [default = %s]\n"
                ,pcVar6);
      pcVar6 = "yes";
      if (local_6c == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-b     : toggle generating radix-4 Booth multipliers [default = %s]\n",pcVar6)
      ;
      pcVar6 = "yes";
      if (local_7c == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-q     : toggle generating non-restoring square root [default = %s]\n",pcVar6)
      ;
      pcVar6 = "yes";
      if (local_68 == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-a     : toggle generating carry-look-ahead adder [default = %s]\n",pcVar6);
      pcVar6 = "yes";
      if (local_d4 == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-d     : toggle creating dual-output multi-output miter [default = %s]\n",
                pcVar6);
      pcVar6 = "yes";
      if (local_64 == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,
                "\t-e     : toggle creating miter with output word bits combined [default = %s]\n",
                pcVar6);
      pcVar6 = "yes";
      if (local_78 == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-s     : toggle creating decoded MUXes [default = %s]\n",pcVar6);
      pcVar6 = "yes";
      if (local_84 == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-t     : toggle creating regular multi-output miter [default = %s]\n",pcVar6);
      pcVar6 = "yes";
      if (local_88 == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-n     : toggle dumping signal names into a text file [default = %s]\n",pcVar6
               );
      pcVar6 = "yes";
      if (local_80 == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-i     : toggle to print input names after blasting [default = %s]\n",pcVar6);
      pcVar6 = "yes";
      if (local_60 == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-z     : toggle saving flop names after blasting [default = %s]\n",pcVar6);
      if (local_5c == 0) {
        pcVar8 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar8);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandBlast( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Wlc_NtkPrintInputInfo( Wlc_Ntk_t * pNtk );
    Wlc_Ntk_t * pNtk = Wlc_AbcGetNtk(pAbc);
    Gia_Man_t * pNew = NULL; int c, fMiter = 0, fDumpNames = 0, fPrintInputInfo = 0;
    Wlc_BstPar_t Par, * pPar = &Par;
    Wlc_BstParDefault( pPar );
    pPar->nOutputRange = 2;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "ORAMcombqadestnizvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'O':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-O\" should be followed by an integer.\n" );
                goto usage;
            }
            pPar->iOutput = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPar->iOutput < 0 )
                goto usage;
            break;
        case 'R':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-R\" should be followed by an integer.\n" );
                goto usage;
            }
            pPar->nOutputRange = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPar->nOutputRange < 0 )
                goto usage;
            break;
        case 'A':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-A\" should be followed by an integer.\n" );
                goto usage;
            }
            pPar->nAdderLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPar->nAdderLimit < 0 )
                goto usage;
            break;
        case 'M':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-M\" should be followed by an integer.\n" );
                goto usage;
            }
            pPar->nMultLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPar->nMultLimit < 0 )
                goto usage;
            break;
        case 'c':
            pPar->fGiaSimple ^= 1;
            break;
        case 'o':
            pPar->fAddOutputs ^= 1;
            break;
        case 'm':
            pPar->fMulti ^= 1;
            break;
        case 'b':
            pPar->fBooth ^= 1;
            break;
        case 'q':
            pPar->fNonRest ^= 1;
            break;
        case 'a':
            pPar->fCla ^= 1;
            break;
        case 'd':
            pPar->fCreateMiter ^= 1;
            break;
        case 'e':
            pPar->fCreateWordMiter ^= 1;
            break;
        case 's':
            pPar->fDecMuxes ^= 1;
            break;
        case 't':
            pPar->fCreateMiter ^= 1;
            fMiter ^= 1;
            break;
        case 'n':
            fDumpNames ^= 1;
            break;
        case 'i': 
            fPrintInputInfo ^= 1; 
            break;
        case 'z': 
            pPar->fSaveFfNames ^= 1; 
            break;
        case 'v':
            pPar->fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( 1, "Abc_CommandBlast(): There is no current design.\n" );
        return 0;
    }
    if ( pNtk->fAsyncRst )
    {
        Abc_Print( 1, "Abc_CommandBlast(): Trying to bit-blast network with asynchronous reset.\n" );
        return 0;
    }
    if ( fPrintInputInfo )
        Wlc_NtkPrintInputInfo(pNtk); 
    if ( pPar->fMulti )
    {
        pPar->vBoxIds = Wlc_NtkCollectMultipliers( pNtk );
        if ( pPar->vBoxIds == NULL )
            Abc_Print( 1, "Warning:  There is no multipliers in the design.\n" );
    }
    else if ( pPar->nAdderLimit || pPar->nMultLimit )
    {
        int CountA, CountM;
        pPar->vBoxIds = Wlc_NtkCollectAddMult( pNtk, pPar, &CountA, &CountM );
        if ( pPar->vBoxIds == NULL )
            Abc_Print( 1, "Warning:  There is no adders and multipliers that will not be blasted.\n" );
        else 
            Abc_Print( 1, "Warning:  %d adders and %d multipliers will not be blasted.\n", CountA, CountM );
    }
    if ( pPar->iOutput >= 0 && pPar->iOutput + pPar->nOutputRange > Wlc_NtkPoNum(pNtk) )
    {
        Abc_Print( 1, "Abc_CommandBlast(): The output range [%d:%d] is incorrect.\n", pPar->iOutput, pPar->iOutput + pPar->nOutputRange - 1 );
        return 0;
    }
    // transform
    pNew = Wlc_NtkBitBlast( pNtk, pPar );
    Vec_IntFreeP( &pPar->vBoxIds );
    if ( pNew == NULL )
    {
        Abc_Print( 1, "Abc_CommandBlast(): Bit-blasting has failed.\n" );
        return 0;
    }
    // generate miter
    if ( fMiter )
    {
        Gia_Man_t * pTemp = pNew;
        pNew = Gia_ManTransformMiter( pNew );
        Gia_ManStop( pTemp );
        Abc_Print( 1, "Bit-blasting created a traditional multi-output miter by XORing POs pair-wise.\n" );
        if ( fDumpNames )
        {
            int i; char * pName;
            FILE * pFile = fopen( "pio_name_map.txt", "wb" );
            if ( pNew->vNamesIn )
                Vec_PtrForEachEntry( char *, pNew->vNamesIn, pName, i )
                    fprintf( pFile, "i%d %s\n", i, pName );
            if ( pNew->vNamesOut )
                Vec_PtrForEachEntry( char *, pNew->vNamesOut, pName, i )
                    fprintf( pFile, "o%d %s\n", i, pName );
            fclose( pFile );
            Abc_Print( 1, "Finished dumping file \"pio_name_map.txt\" containing PI/PO name mapping.\n" );
        }
    }
    Abc_FrameUpdateGia( pAbc, pNew );
    return 0;
usage:
    Abc_Print( -2, "usage: %%blast [-ORAM num] [-combqadestnizvh]\n" );
    Abc_Print( -2, "\t         performs bit-blasting of the word-level design\n" );
    Abc_Print( -2, "\t-O num : zero-based index of the first word-level PO to bit-blast [default = %d]\n", pPar->iOutput );
    Abc_Print( -2, "\t-R num : the total number of word-level POs to bit-blast [default = %d]\n",          pPar->nOutputRange );
    Abc_Print( -2, "\t-A num : blast adders smaller than this (0 = unused) [default = %d]\n",              pPar->nAdderLimit );
    Abc_Print( -2, "\t-M num : blast multipliers smaller than this (0 = unused) [default = %d]\n",         pPar->nMultLimit );
    Abc_Print( -2, "\t-c     : toggle using AIG w/o const propagation and strashing [default = %s]\n",     pPar->fGiaSimple? "yes": "no" );
    Abc_Print( -2, "\t-o     : toggle using additional POs on the word-level boundaries [default = %s]\n", pPar->fAddOutputs? "yes": "no" );
    Abc_Print( -2, "\t-m     : toggle creating boxes for all multipliers in the design [default = %s]\n",  pPar->fMulti? "yes": "no" );
    Abc_Print( -2, "\t-b     : toggle generating radix-4 Booth multipliers [default = %s]\n",              pPar->fBooth? "yes": "no" );
    Abc_Print( -2, "\t-q     : toggle generating non-restoring square root [default = %s]\n",              pPar->fNonRest? "yes": "no" );
    Abc_Print( -2, "\t-a     : toggle generating carry-look-ahead adder [default = %s]\n",                 pPar->fCla? "yes": "no" );
    Abc_Print( -2, "\t-d     : toggle creating dual-output multi-output miter [default = %s]\n",           pPar->fCreateMiter? "yes": "no" );
    Abc_Print( -2, "\t-e     : toggle creating miter with output word bits combined [default = %s]\n",     pPar->fCreateWordMiter? "yes": "no" );
    Abc_Print( -2, "\t-s     : toggle creating decoded MUXes [default = %s]\n",                            pPar->fDecMuxes? "yes": "no" );
    Abc_Print( -2, "\t-t     : toggle creating regular multi-output miter [default = %s]\n",               fMiter? "yes": "no" );
    Abc_Print( -2, "\t-n     : toggle dumping signal names into a text file [default = %s]\n",             fDumpNames? "yes": "no" );
    Abc_Print( -2, "\t-i     : toggle to print input names after blasting [default = %s]\n",               fPrintInputInfo ? "yes": "no" );
    Abc_Print( -2, "\t-z     : toggle saving flop names after blasting [default = %s]\n",                  pPar->fSaveFfNames ? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n",                      pPar->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}